

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O0

int WriteOutput(sunrealtype t,N_Vector y,N_Vector e,sunrealtype ec,int screenfile,FILE *YFID,
               FILE *EFID)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  FILE *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  FILE *in_R8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  sunrealtype *edata;
  sunrealtype *ydata;
  
  puVar1 = (undefined8 *)N_VGetArrayPointer(in_RDI);
  puVar2 = (undefined8 *)N_VGetArrayPointer(in_RSI);
  if (in_EDX == 0) {
    printf("%0.4e %14.6e %14.6e %14.6e %14.6e %14.6e\n",in_XMM0_Qa,*puVar1,puVar1[1],*puVar2,
           puVar2[1],in_XMM1_Qa);
  }
  else {
    if ((in_RCX == (FILE *)0x0) || (in_R8 == (FILE *)0x0)) {
      return 1;
    }
    fprintf(in_RCX,"%24.16e %24.16e %24.16e\n",in_XMM0_Qa,*puVar1,puVar1[1]);
    fprintf(in_R8,"%24.16e %24.16e %24.16e %24.16e\n",in_XMM0_Qa,*puVar2,puVar2[1],in_XMM1_Qa);
  }
  return 0;
}

Assistant:

static int WriteOutput(sunrealtype t, N_Vector y, N_Vector e, sunrealtype ec,
                       int screenfile, FILE* YFID, FILE* EFID)
{
  sunrealtype* ydata = N_VGetArrayPointer(y);
  sunrealtype* edata = N_VGetArrayPointer(e);

  if (screenfile == 0)
  {
    /* output solution and error to screen */
    printf("%0.4" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM
           " %14.6" ESYM "\n",
           t, ydata[0], ydata[1], edata[0], edata[1], ec);
  }
  else
  {
    /* check file pointers */
    if (YFID == NULL || EFID == NULL) { return (1); }

    /* output solution to disk */
    fprintf(YFID, "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM "\n", t, ydata[0],
            ydata[1]);

    /* output error to disk */
    fprintf(EFID, "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM "\n",
            t, edata[0], edata[1], ec);
  }

  return (0);
}